

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_16x64_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  ushort uVar16;
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  int j;
  long lVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  short sVar34;
  short sVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar43;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  short sVar39;
  
  auVar35 = *(undefined1 (*) [16])above;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar35._0_13_;
  auVar10[0xe] = auVar35[7];
  auVar11[0xc] = auVar35[6];
  auVar11._0_12_ = auVar35._0_12_;
  auVar11._13_2_ = auVar10._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar35._0_11_;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13[10] = auVar35[5];
  auVar13._0_10_ = auVar35._0_10_;
  auVar13._11_4_ = auVar12._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar35._0_9_;
  auVar14._10_5_ = auVar13._10_5_;
  auVar15[8] = auVar35[4];
  auVar15._0_8_ = auVar35._0_8_;
  auVar15._9_6_ = auVar14._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar15._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar35[3]);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar19[0] = auVar35[2];
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar19;
  auVar20._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar20[0] = auVar35[1];
  auVar33._0_2_ = CONCAT11(0,auVar35[0]);
  auVar33._2_13_ = auVar20;
  auVar33[0xf] = 0;
  auVar25._0_2_ = CONCAT11(0,auVar35[8]);
  bVar26 = auVar35[9];
  auVar25[2] = bVar26;
  auVar25[3] = 0;
  bVar27 = auVar35[10];
  auVar25[4] = bVar27;
  auVar25[5] = 0;
  bVar28 = auVar35[0xb];
  auVar25[6] = bVar28;
  auVar25[7] = 0;
  bVar29 = auVar35[0xc];
  auVar25[8] = bVar29;
  auVar25[9] = 0;
  bVar30 = auVar35[0xd];
  auVar25[10] = bVar30;
  auVar25[0xb] = 0;
  bVar31 = auVar35[0xe];
  auVar25[0xc] = bVar31;
  auVar25[0xd] = 0;
  bVar32 = auVar35[0xf];
  auVar25[0xe] = bVar32;
  auVar25[0xf] = 0;
  auVar35 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar36._0_4_ = auVar35._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  sVar34 = auVar35._0_2_;
  auVar38._0_2_ = auVar33._0_2_ - sVar34;
  sVar37 = auVar35._2_2_;
  auVar38._2_2_ = auVar20._0_2_ - sVar37;
  auVar38._4_2_ = auVar19._0_2_ - sVar34;
  sVar39 = (short)Var18;
  auVar38._6_2_ = sVar39 - sVar37;
  auVar38._8_2_ = auVar15._8_2_ - sVar34;
  auVar38._10_2_ = auVar13._10_2_ - sVar37;
  uVar16 = auVar10._13_2_ >> 8;
  auVar38._12_2_ = auVar11._12_2_ - sVar34;
  auVar38._14_2_ = uVar16 - sVar37;
  auVar35 = pabsw(in_XMM4,auVar38);
  lVar23 = 0;
  auVar40._0_2_ = auVar25._0_2_ - sVar34;
  auVar40._2_2_ = (ushort)bVar26 - sVar37;
  auVar40._4_2_ = (ushort)bVar27 - sVar34;
  auVar40._6_2_ = (ushort)bVar28 - sVar37;
  auVar40._8_2_ = (ushort)bVar29 - sVar34;
  auVar40._10_2_ = (ushort)bVar30 - sVar37;
  auVar40._12_2_ = (ushort)bVar31 - sVar34;
  auVar40._14_2_ = (ushort)bVar32 - sVar37;
  auVar40 = pabsw(in_XMM5,auVar40);
  do {
    auVar1 = *(undefined1 (*) [16])(left + lVar23 * 0x10);
    iVar24 = 0x10;
    auVar41 = _DAT_004db440;
    do {
      auVar42 = pshufb(auVar1,auVar41);
      sVar43 = auVar38._0_2_ + auVar42._0_2_;
      sVar45 = auVar38._2_2_ + auVar42._2_2_;
      sVar46 = auVar38._4_2_ + auVar42._4_2_;
      sVar47 = auVar38._6_2_ + auVar42._6_2_;
      sVar48 = auVar38._8_2_ + auVar42._8_2_;
      sVar49 = auVar38._10_2_ + auVar42._10_2_;
      sVar50 = auVar38._12_2_ + auVar42._12_2_;
      sVar51 = auVar38._14_2_ + auVar42._14_2_;
      auVar58._0_2_ = sVar43 - auVar33._0_2_;
      auVar58._2_2_ = sVar45 - auVar20._0_2_;
      auVar58._4_2_ = sVar46 - auVar19._0_2_;
      auVar58._6_2_ = sVar47 - sVar39;
      auVar58._8_2_ = sVar48 - auVar15._8_2_;
      auVar58._10_2_ = sVar49 - auVar13._10_2_;
      auVar58._12_2_ = sVar50 - auVar11._12_2_;
      auVar58._14_2_ = sVar51 - uVar16;
      auVar52 = pabsw(auVar58,auVar58);
      auVar54._0_2_ = sVar43 - sVar34;
      auVar54._2_2_ = sVar45 - sVar37;
      auVar54._4_2_ = sVar46 - sVar34;
      auVar54._6_2_ = sVar47 - sVar37;
      auVar54._8_2_ = sVar48 - sVar34;
      auVar54._10_2_ = sVar49 - sVar37;
      auVar54._12_2_ = sVar50 - sVar34;
      auVar54._14_2_ = sVar51 - sVar37;
      auVar54 = pabsw(in_XMM13,auVar54);
      auVar57._0_2_ = -(ushort)(auVar52._0_2_ < auVar35._0_2_);
      auVar57._2_2_ = -(ushort)(auVar52._2_2_ < auVar35._2_2_);
      auVar57._4_2_ = -(ushort)(auVar52._4_2_ < auVar35._4_2_);
      auVar57._6_2_ = -(ushort)(auVar52._6_2_ < auVar35._6_2_);
      auVar57._8_2_ = -(ushort)(auVar52._8_2_ < auVar35._8_2_);
      auVar57._10_2_ = -(ushort)(auVar52._10_2_ < auVar35._10_2_);
      auVar57._12_2_ = -(ushort)(auVar52._12_2_ < auVar35._12_2_);
      auVar57._14_2_ = -(ushort)(auVar52._14_2_ < auVar35._14_2_);
      auVar44._0_2_ = -(ushort)(auVar54._0_2_ < auVar35._0_2_);
      auVar44._2_2_ = -(ushort)(auVar54._2_2_ < auVar35._2_2_);
      auVar44._4_2_ = -(ushort)(auVar54._4_2_ < auVar35._4_2_);
      auVar44._6_2_ = -(ushort)(auVar54._6_2_ < auVar35._6_2_);
      auVar44._8_2_ = -(ushort)(auVar54._8_2_ < auVar35._8_2_);
      auVar44._10_2_ = -(ushort)(auVar54._10_2_ < auVar35._10_2_);
      auVar44._12_2_ = -(ushort)(auVar54._12_2_ < auVar35._12_2_);
      auVar44._14_2_ = -(ushort)(auVar54._14_2_ < auVar35._14_2_);
      auVar53._0_2_ = -(ushort)(auVar54._0_2_ < auVar52._0_2_);
      auVar53._2_2_ = -(ushort)(auVar54._2_2_ < auVar52._2_2_);
      auVar53._4_2_ = -(ushort)(auVar54._4_2_ < auVar52._4_2_);
      auVar53._6_2_ = -(ushort)(auVar54._6_2_ < auVar52._6_2_);
      auVar53._8_2_ = -(ushort)(auVar54._8_2_ < auVar52._8_2_);
      auVar53._10_2_ = -(ushort)(auVar54._10_2_ < auVar52._10_2_);
      auVar53._12_2_ = -(ushort)(auVar54._12_2_ < auVar52._12_2_);
      auVar53._14_2_ = -(ushort)(auVar54._14_2_ < auVar52._14_2_);
      auVar55._0_2_ = auVar42._0_2_ - sVar34;
      auVar55._2_2_ = auVar42._2_2_ - sVar37;
      auVar55._4_2_ = auVar42._4_2_ - sVar34;
      auVar55._6_2_ = auVar42._6_2_ - sVar37;
      auVar55._8_2_ = auVar42._8_2_ - sVar34;
      auVar55._10_2_ = auVar42._10_2_ - sVar37;
      auVar55._12_2_ = auVar42._12_2_ - sVar34;
      auVar55._14_2_ = auVar42._14_2_ - sVar37;
      auVar58 = pabsw(auVar57,auVar55);
      auVar56._0_2_ = (auVar55._0_2_ + auVar25._0_2_) - sVar34;
      auVar56._2_2_ = (auVar55._2_2_ + (ushort)bVar26) - sVar37;
      auVar56._4_2_ = (auVar55._4_2_ + (ushort)bVar27) - sVar34;
      auVar56._6_2_ = (auVar55._6_2_ + (ushort)bVar28) - sVar37;
      auVar56._8_2_ = (auVar55._8_2_ + (ushort)bVar29) - sVar34;
      auVar56._10_2_ = (auVar55._10_2_ + (ushort)bVar30) - sVar37;
      auVar56._12_2_ = (auVar55._12_2_ + (ushort)bVar31) - sVar34;
      auVar56._14_2_ = (auVar55._14_2_ + (ushort)bVar32) - sVar37;
      auVar54 = pabsw(auVar56,auVar56);
      auVar60._0_2_ = -(ushort)(auVar58._0_2_ < auVar40._0_2_);
      auVar60._2_2_ = -(ushort)(auVar58._2_2_ < auVar40._2_2_);
      auVar60._4_2_ = -(ushort)(auVar58._4_2_ < auVar40._4_2_);
      auVar60._6_2_ = -(ushort)(auVar58._6_2_ < auVar40._6_2_);
      auVar60._8_2_ = -(ushort)(auVar58._8_2_ < auVar40._8_2_);
      auVar60._10_2_ = -(ushort)(auVar58._10_2_ < auVar40._10_2_);
      auVar60._12_2_ = -(ushort)(auVar58._12_2_ < auVar40._12_2_);
      auVar60._14_2_ = -(ushort)(auVar58._14_2_ < auVar40._14_2_);
      auVar52._0_2_ = -(ushort)(auVar54._0_2_ < auVar40._0_2_);
      auVar52._2_2_ = -(ushort)(auVar54._2_2_ < auVar40._2_2_);
      auVar52._4_2_ = -(ushort)(auVar54._4_2_ < auVar40._4_2_);
      auVar52._6_2_ = -(ushort)(auVar54._6_2_ < auVar40._6_2_);
      auVar52._8_2_ = -(ushort)(auVar54._8_2_ < auVar40._8_2_);
      auVar52._10_2_ = -(ushort)(auVar54._10_2_ < auVar40._10_2_);
      auVar52._12_2_ = -(ushort)(auVar54._12_2_ < auVar40._12_2_);
      auVar52._14_2_ = -(ushort)(auVar54._14_2_ < auVar40._14_2_);
      auVar59._0_2_ = -(ushort)(auVar54._0_2_ < auVar58._0_2_);
      auVar59._2_2_ = -(ushort)(auVar54._2_2_ < auVar58._2_2_);
      auVar59._4_2_ = -(ushort)(auVar54._4_2_ < auVar58._4_2_);
      auVar59._6_2_ = -(ushort)(auVar54._6_2_ < auVar58._6_2_);
      auVar59._8_2_ = -(ushort)(auVar54._8_2_ < auVar58._8_2_);
      auVar59._10_2_ = -(ushort)(auVar54._10_2_ < auVar58._10_2_);
      auVar59._12_2_ = -(ushort)(auVar54._12_2_ < auVar58._12_2_);
      auVar59._14_2_ = -(ushort)(auVar54._14_2_ < auVar58._14_2_);
      in_XMM13 = auVar36 & auVar59;
      auVar54 = ~(auVar44 | auVar57) & auVar42 |
                (~auVar53 & auVar33 | auVar36 & auVar53) & (auVar44 | auVar57);
      auVar52 = ~(auVar52 | auVar60) & auVar42 |
                (~auVar59 & auVar25 | in_XMM13) & (auVar52 | auVar60);
      sVar43 = auVar54._0_2_;
      sVar45 = auVar54._2_2_;
      sVar46 = auVar54._4_2_;
      sVar47 = auVar54._6_2_;
      sVar48 = auVar54._8_2_;
      sVar49 = auVar54._10_2_;
      sVar50 = auVar54._12_2_;
      sVar51 = auVar54._14_2_;
      sVar2 = auVar52._0_2_;
      sVar3 = auVar52._2_2_;
      sVar4 = auVar52._4_2_;
      sVar5 = auVar52._6_2_;
      sVar6 = auVar52._8_2_;
      sVar7 = auVar52._10_2_;
      sVar8 = auVar52._12_2_;
      sVar9 = auVar52._14_2_;
      *dst = (0 < sVar43) * (sVar43 < 0x100) * auVar54[0] - (0xff < sVar43);
      dst[1] = (0 < sVar45) * (sVar45 < 0x100) * auVar54[2] - (0xff < sVar45);
      dst[2] = (0 < sVar46) * (sVar46 < 0x100) * auVar54[4] - (0xff < sVar46);
      dst[3] = (0 < sVar47) * (sVar47 < 0x100) * auVar54[6] - (0xff < sVar47);
      dst[4] = (0 < sVar48) * (sVar48 < 0x100) * auVar54[8] - (0xff < sVar48);
      dst[5] = (0 < sVar49) * (sVar49 < 0x100) * auVar54[10] - (0xff < sVar49);
      dst[6] = (0 < sVar50) * (sVar50 < 0x100) * auVar54[0xc] - (0xff < sVar50);
      dst[7] = (0 < sVar51) * (sVar51 < 0x100) * auVar54[0xe] - (0xff < sVar51);
      dst[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar52[0] - (0xff < sVar2);
      dst[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar52[2] - (0xff < sVar3);
      dst[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar52[4] - (0xff < sVar4);
      dst[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar52[6] - (0xff < sVar5);
      dst[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar52[8] - (0xff < sVar6);
      dst[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar52[10] - (0xff < sVar7);
      dst[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar52[0xc] - (0xff < sVar8);
      dst[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0xe] - (0xff < sVar9);
      dst = dst + stride;
      auVar42._0_2_ = auVar41._0_2_ + 1;
      auVar42._2_2_ = auVar41._2_2_ + 1;
      auVar42._4_2_ = auVar41._4_2_ + 1;
      auVar42._6_2_ = auVar41._6_2_ + 1;
      auVar42._8_2_ = auVar41._8_2_ + 1;
      auVar42._10_2_ = auVar41._10_2_ + 1;
      auVar42._12_2_ = auVar41._12_2_ + 1;
      auVar42._14_2_ = auVar41._14_2_ + 1;
      iVar24 = iVar24 + -1;
      auVar41 = auVar42;
    } while (iVar24 != 0);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_16x64_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);

  for (int j = 0; j < 4; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (int i = 0; i < 16; ++i) {
      const __m128i l16 = _mm_shuffle_epi8(l, rep);
      const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);
      _mm_store_si128((__m128i *)dst, row);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}